

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O1

int multishot_max(monst *mtmp,obj *otmp)

{
  uint uVar1;
  byte bVar2;
  char cVar3;
  short sVar4;
  obj *poVar5;
  xchar xVar6;
  int iVar7;
  bool bVar8;
  obj **ppoVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  
  if (mtmp == (monst *)0x0) {
    return 1;
  }
  sVar4 = otmp->otyp;
  bVar2 = objects[sVar4].oc_subtyp;
  iVar10 = (int)(char)bVar2;
  if (mtmp == &youmonst) {
    ppoVar9 = &uwep;
  }
  else {
    ppoVar9 = &mtmp->mw;
  }
  poVar5 = *ppoVar9;
  cVar3 = otmp->oclass;
  if ((cVar3 == '\r') || (cVar3 == '\x02')) {
    if (((char)bVar2 < -0x18) ||
       ((poVar5 == (obj *)0x0 || -0x16 < (char)bVar2 ||
        (objects[poVar5->otyp].oc_subtyp + iVar10 != 0)))) {
      if ((cVar3 != '\x02') ||
         (((byte)(bVar2 + 0x18) < 3 &&
          ((poVar5 == (obj *)0x0 || (objects[poVar5->otyp].oc_subtyp + iVar10 != 0))))))
      goto LAB_0017e750;
      if ((bVar2 & 0xfe) != 0x12) {
        uVar1 = bVar2 - 0xe5;
        if ((((3 < uVar1) || (uVar1 == 2)) && (bVar2 != 1)) && ((bVar2 & 0xfe) != 0xe6)) {
          return 1;
        }
      }
    }
  }
  else {
LAB_0017e750:
    if ((1 < bVar2 - 0xe6) && (bVar2 != 1)) {
      return 1;
    }
  }
  if (mtmp == &youmonst) {
    if (u.uprops[0x1c].intrinsic != 0) {
      return 1;
    }
    if (u.uprops[0x1b].intrinsic != 0) {
      return 1;
    }
    if (u.umonnum == 0x9e) {
      return 1;
    }
    if ((youmonst.data)->mlet == '\x1c') {
      return 1;
    }
  }
  else if ((mtmp->field_0x62 & 0x30) != 0) {
    return 1;
  }
  if (((cVar3 == '\r') || (iVar11 = 0, cVar3 == '\x02')) &&
     ((iVar11 = 0, -0x19 < (char)bVar2 && (poVar5 != (obj *)0x0 && (char)bVar2 < -0x15)))) {
    iVar11 = (int)poVar5->otyp;
    if (objects[(int)poVar5->otyp].oc_subtyp + iVar10 != 0) {
      iVar11 = 0;
    }
  }
  iVar10 = weapon_type(otmp);
  xVar6 = mon_skill_level(iVar10,mtmp);
  iVar10 = 3;
  if (xVar6 != '\x04') {
    iVar10 = (xVar6 == '\x03') + 1;
  }
  if (bVar2 == 0x13) {
    iVar10 = iVar10 + (uint)('\x01' < u.weapon_skills[0x13].skill || mtmp != &youmonst);
  }
  if (mtmp == &youmonst) {
    iVar7 = (int)urole.malenum;
  }
  else {
    iVar7 = monsndx(mtmp->data);
  }
  if (iVar7 < 0x165) {
    if (iVar7 == 0x163) {
      iVar10 = iVar10 + 1;
    }
    else if (iVar7 == 0x164) {
      bVar12 = bVar2 == 1;
      goto LAB_0017e8c1;
    }
  }
  else if ((iVar7 == 0x165) || (iVar7 == 0x18e)) {
    bVar12 = iVar11 == 0x45 && sVar4 == 5;
LAB_0017e8c1:
    iVar10 = iVar10 + (uint)bVar12;
  }
  if (mtmp == &youmonst) {
    if (urace.malenum == 0x111) goto LAB_0017e911;
LAB_0017e8da:
    if (mtmp == &youmonst) {
      if (urace.malenum != 0x2d) goto LAB_0017e8ed;
    }
    else if ((mtmp->data->mflags2 & 0x20) == 0) {
LAB_0017e8ed:
      if (mtmp == &youmonst) {
        if (urace.malenum != 0x4a) {
          return iVar10;
        }
      }
      else if ((mtmp->data->mflags2 & 0x80) == 0) {
        return iVar10;
      }
      bVar8 = iVar11 == 0x44 && sVar4 == 3;
      bVar12 = sVar4 == 0xc;
      goto LAB_0017e927;
    }
    bVar12 = sVar4 == 0xd;
  }
  else {
    if ((mtmp->data->mflags2 & 0x10) == 0) goto LAB_0017e8da;
LAB_0017e911:
    bVar8 = iVar11 == 0x43 && sVar4 == 2;
    bVar12 = sVar4 == 0xb;
LAB_0017e927:
    bVar12 = (bool)(bVar12 | bVar8);
  }
  return iVar10 + (uint)bVar12;
}

Assistant:

int multishot_max(const struct monst *mtmp, const struct obj *otmp)
{
	boolean you_shot;
	schar skill;
	const struct obj *wwep;
	int multishot = 1;

	if (!mtmp)
	    return 1;

	you_shot = (mtmp == &youmonst);

	skill = objects[otmp->otyp].oc_skill;
	wwep = you_shot ? uwep : MON_WEP(mtmp);

	if ((ammo_and_launcher(otmp, wwep) || is_heavyshot(otmp, wwep) ||
	     skill == P_DAGGER || skill == -P_DART || skill == -P_SHURIKEN) &&
	    !(you_shot ? (Confusion || Stunned) :
			 (mtmp->mconf || mtmp->mstun))) {
	    short otyp, lotyp;
	    xchar sklev;
	    otyp = otmp->otyp;
	    lotyp = ammo_and_launcher(otmp, wwep) ? wwep->otyp : 0;
	    sklev = mon_skill_level(weapon_type(otmp), mtmp);

	    /* bonus for skill */
	    if (sklev == P_EXPERT) {
		multishot += 2;
	    } else if (sklev == P_SKILLED) {
		multishot++;
	    }

	    /* bonus for javelins so they're not just inferior spears */
	    if (skill == P_JAVELIN && (!you_shot || P_SKILL(P_JAVELIN) >= P_BASIC))
		multishot++;

	    /* bonus for role */
	    switch (you_shot ? Role_switch :
			       monsndx(mtmp->data)) {
	    case PM_RANGER:
		multishot++;
		break;
	    case PM_ROGUE:
		if (skill == P_DAGGER)
		    multishot++;
		break;
	    case PM_NINJA: /* for monsters */
	    case PM_SAMURAI:
		if (otyp == YA && lotyp == YUMI)
		    multishot++;
		break;
	    default:
		break;	/* No bonus */
	    }

	    /* bonus for race */
	    if (you_shot ? (Race_switch == PM_ELF) :
			   is_elf(mtmp->data)) {
		if ((otyp == ELVEN_ARROW && lotyp == ELVEN_BOW) ||
		    otyp == ELVEN_SPEAR)
		    multishot++;
	    } else if (you_shot ? (Race_switch == PM_DWARF) :
				  is_dwarf(mtmp->data)) {
		if (otyp == DWARVISH_SPEAR)
		    multishot++;
	    } else if (you_shot ? (Race_switch == PM_ORC) :
				  is_orc(mtmp->data)) {
		if ((otyp == ORCISH_ARROW && lotyp == ORCISH_BOW) ||
		    otyp == ORCISH_SPEAR)
		    multishot++;
	    }
	}

	return multishot;
}